

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O1

bool __thiscall Jinx::Impl::Runtime::PropertyExists(Runtime *this,RuntimeID id)

{
  int iVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_propertyMutex);
  if (iVar1 == 0) {
    p_Var4 = &(this->m_propertyMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = (this->m_propertyMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var2 = &p_Var4->_M_header;
    for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[*(ulong *)(p_Var3 + 1) < id]) {
      if (*(ulong *)(p_Var3 + 1) >= id) {
        p_Var2 = p_Var3;
      }
    }
    p_Var3 = &p_Var4->_M_header;
    if (((_Rb_tree_header *)p_Var2 != p_Var4) && (p_Var3 = p_Var2, id < *(ulong *)(p_Var2 + 1))) {
      p_Var3 = &p_Var4->_M_header;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_propertyMutex);
    return (_Rb_tree_header *)p_Var3 != p_Var4;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

inline_t bool Runtime::PropertyExists(RuntimeID id) const
	{
		std::lock_guard<std::mutex> lock(m_propertyMutex);
		return m_propertyMap.find(id) != m_propertyMap.end();
	}